

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

FX * get_nextFX(FX *fx)

{
  uint uVar1;
  
  if (URaid_scanlink == 0) {
    uVar1 = (*(uint *)fx & 0xfffffffe) - 10;
  }
  else {
    uVar1 = *(int *)((long)&fx->alink + (ulong)((*(uint *)fx & 1) << 4)) - 10;
    if ((uVar1 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",
             (ulong)(uVar1 & 0xffff));
    }
  }
  return (FX *)((ulong)((uVar1 & 0xffff) * 2) + (long)Stackspace);
}

Assistant:

FX *get_nextFX(FX *fx) {

  if (URaid_scanlink == URSCAN_ALINK)
    return ((FX *)NativeAligned4FromStackOffset(GETALINK(fx)));
  else
    return ((FX *)NativeAligned4FromStackOffset(GETCLINK(fx)));

}